

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringTest_MemoryUsageComparison_Test::TestBody
          (MicroStringTest_MemoryUsageComparison_Test *this)

{
  _Alloc_hider _Var1;
  size_t sVar2;
  Arena *in_R8;
  MicroString *self;
  string_view value;
  string_view data;
  int64_t this_arena_str_used;
  int64_t this_micro_str_used;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_158;
  int64_t arena_str_used;
  int64_t micro_str_used;
  ArenaStringPtr arena_str;
  AssertionResult gtest_ar;
  AssertHelper local_128;
  size_t size_min;
  MicroString micro_str;
  string input;
  anon_class_24_3_b181217e print_range;
  Arena arena;
  
  ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  micro_str.rep_ = (void *)0x0;
  arena_str.tagged_ptr_.ptr_ = (TaggedStringPtr)&fixed_address_empty_string;
  input._M_dataplus._M_p = (pointer)&input.field_2;
  std::__cxx11::string::_M_construct((ulong)&input,-0x38);
  print_range.size_min = &size_min;
  size_min = 0;
  print_range.micro_str_used = &micro_str_used;
  micro_str_used = 0;
  print_range.arena_str_used = &arena_str_used;
  arena_str_used = 0;
  for (self = (MicroString *)0x1; _Var1._M_p = input._M_dataplus._M_p, self < input._M_string_length
      ; self = (MicroString *)((long)&self->rep_ + 1)) {
    data._M_str = (char *)&arena;
    data._M_len = (size_t)input._M_dataplus._M_p;
    MicroString::SetMaybeConstant<google::protobuf::internal::MicroString>
              (&micro_str,self,data,in_R8);
    value._M_str = _Var1._M_p;
    value._M_len = (size_t)self;
    ArenaStringPtr::Set(&arena_str,value,&arena);
    this_micro_str_used = MicroString::SpaceUsedExcludingSelfLong(&micro_str);
    if (((ulong)arena_str.tagged_ptr_.ptr_ & 3) == 0) {
      this_arena_str_used = 0;
    }
    else {
      sVar2 = StringSpaceUsedExcludingSelfLong
                        ((string *)((ulong)arena_str.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      this_arena_str_used = sVar2 + 0x20;
    }
    in_R8 = (Arena *)&this_arena_str_used;
    testing::internal::CmpHelperLE<long,long>
              ((internal *)&gtest_ar,"this_micro_str_used","this_arena_str_used",
               &this_micro_str_used,&this_arena_str_used);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_158);
      in_R8 = (Arena *)(anon_var_dwarf_651463 + 5);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        in_R8 = *(Arena **)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                 ,0x427,(char *)in_R8);
      testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_158._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (this_micro_str_used - this_arena_str_used != micro_str_used - arena_str_used) {
      TestBody::anon_class_24_3_b181217e::operator()
                (&print_range,(size_t)((long)&self[-1].rep_ + 7));
      micro_str_used = this_micro_str_used;
      arena_str_used = this_arena_str_used;
      size_min = (size_t)self;
    }
  }
  TestBody::anon_class_24_3_b181217e::operator()(&print_range,input._M_string_length);
  std::__cxx11::string::~string((string *)&input);
  ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  return;
}

Assistant:

TEST(MicroStringTest, MemoryUsageComparison) {
  Arena arena;
  MicroString micro_str;
  ArenaStringPtr arena_str;
  arena_str.InitDefault();

  const std::string input(200, 'x');

  size_t size_min = 0;
  int64_t micro_str_used = 0;
  int64_t arena_str_used = 0;

  const auto print_range = [&](size_t size_max) {
    int64_t diff = micro_str_used - arena_str_used;
    absl::PrintF(
        "[%3d, %3d] MicroString-ArenaStringPtr=%3d (%s) MicroUsed=%3d "
        "ArenaStringPtrUsed=%3d\n",
        size_min, size_max, diff,
        diff == 0  ? "same "
        : diff < 0 ? "saves"
                   : "regrs",
        micro_str_used, arena_str_used);
  };
  for (size_t i = 1; i < input.size(); ++i) {
    absl::string_view this_input(input.data(), i);
    micro_str.Set(this_input, &arena);
    arena_str.Set(this_input, &arena);

    int64_t this_micro_str_used = micro_str.SpaceUsedExcludingSelfLong();
    int64_t this_arena_str_used = SpaceUsedExcludingSelfLong(arena_str);
    // We expect to always use the same or less memory.
    if (sizeof(void*) >= 8) {
      EXPECT_LE(this_micro_str_used, this_arena_str_used);
    } else {
      // Except that in 32-bit platforms we have heap alignment to 4 bytes, but
      // arena alignment is always 8. Take that fact into account by rounding up
      // the ArenaStringPtr use.
      EXPECT_LE(this_micro_str_used,
                ArenaAlignDefault::Ceil(this_arena_str_used));
    }

    int64_t diff = micro_str_used - arena_str_used;
    int64_t this_diff = this_micro_str_used - this_arena_str_used;

    if (this_diff != diff) {
      print_range(i - 1);
      size_min = i;
      micro_str_used = this_micro_str_used;
      arena_str_used = this_arena_str_used;
    }
  }
  print_range(input.size());
}